

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpack-validate.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  long in_RSI;
  int in_EDI;
  exception *ex;
  Exception *ex_1;
  Validator validator;
  Options options;
  char buffer [32768];
  ifstream ifs;
  string s;
  string infile;
  char *p;
  int i;
  bool hex;
  bool allowFlags;
  char *infileName;
  undefined7 in_stack_ffffffffffff7c28;
  undefined1 in_stack_ffffffffffff7c2f;
  Options *in_stack_ffffffffffff7c30;
  uint8_t *in_stack_ffffffffffff7c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff7c40;
  size_type in_stack_ffffffffffff7c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff7c50;
  allocator<char> *in_stack_ffffffffffff7c60;
  string *in_stack_ffffffffffff7c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff7c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff7c78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff7c80;
  undefined1 local_8298 [32772];
  undefined4 local_294;
  char local_290 [520];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_61;
  string local_60 [48];
  char *local_30;
  int local_28;
  byte local_22;
  byte local_21;
  char *local_20;
  long local_18;
  int local_10;
  int local_c;
  undefined8 local_8;
  
  local_c = 0;
  local_20 = (char *)0x0;
  local_21 = 1;
  local_22 = 0;
  local_28 = 1;
  local_18 = in_RSI;
  local_10 = in_EDI;
  while( true ) {
    if (local_10 <= local_28) {
      if (local_20 == (char *)0x0) {
        local_20 = "-";
      }
      if (local_20 == (char *)0x0) {
        usage((char **)0x10468a);
        local_c = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffff7c70,(char *)in_stack_ffffffffffff7c68,
                   in_stack_ffffffffffff7c60);
        std::allocator<char>::~allocator(&local_61);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffff7c30,
                                (char *)CONCAT17(in_stack_ffffffffffff7c2f,in_stack_ffffffffffff7c28
                                                ));
        if (bVar1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff7c30,
                     (char *)CONCAT17(in_stack_ffffffffffff7c2f,in_stack_ffffffffffff7c28));
        }
        std::__cxx11::string::string(in_stack_ffffffffffff7c50);
        std::ifstream::ifstream(local_290,local_60,_S_in);
        bVar2 = std::ifstream::is_open();
        if ((bVar2 & 1) == 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot read infile \'");
          poVar3 = std::operator<<(poVar3,local_60);
          poVar3 = std::operator<<(poVar3,"\'");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          local_c = 1;
          local_294 = 1;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                    (in_stack_ffffffffffff7c50,in_stack_ffffffffffff7c48);
          while (bVar2 = std::ios::good(), (bVar2 & 1) != 0) {
            std::istream::read(local_290,(long)local_8298);
            local_8 = std::istream::gcount();
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (in_stack_ffffffffffff7c40,(char *)in_stack_ffffffffffff7c38,
                       (size_type)in_stack_ffffffffffff7c30);
          }
          std::ifstream::close();
          if ((local_22 & 1) != 0) {
            convertFromHex(in_stack_ffffffffffff7c68);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_ffffffffffff7c80,in_stack_ffffffffffff7c78);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffff7c30);
          }
          arangodb::velocypack::Options::Options(in_stack_ffffffffffff7c30);
          arangodb::velocypack::Validator::Validator
                    ((Validator *)in_stack_ffffffffffff7c30,
                     (Options *)CONCAT17(in_stack_ffffffffffff7c2f,in_stack_ffffffffffff7c28));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1049d1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&local_88);
          arangodb::velocypack::Validator::validate
                    ((Validator *)in_stack_ffffffffffff7c40,in_stack_ffffffffffff7c38,
                     (size_t)in_stack_ffffffffffff7c30,(bool)in_stack_ffffffffffff7c2f);
          poVar3 = std::operator<<((ostream *)&std::cout,"The velocypack in infile \'");
          poVar3 = std::operator<<(poVar3,local_60);
          poVar3 = std::operator<<(poVar3,"\' is valid");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          local_294 = 0;
        }
        std::ifstream::~ifstream(local_290);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffff7c30);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffff7c30);
      }
      return local_c;
    }
    local_30 = *(char **)(local_18 + (long)local_28 * 8);
    if (((local_21 & 1) != 0) &&
       (bVar1 = isOption((char *)in_stack_ffffffffffff7c30,
                         (char *)CONCAT17(in_stack_ffffffffffff7c2f,in_stack_ffffffffffff7c28)),
       bVar1)) break;
    if (((local_21 & 1) == 0) ||
       (bVar1 = isOption((char *)in_stack_ffffffffffff7c30,
                         (char *)CONCAT17(in_stack_ffffffffffff7c2f,in_stack_ffffffffffff7c28)),
       !bVar1)) {
      if (((local_21 & 1) == 0) ||
         (bVar1 = isOption((char *)in_stack_ffffffffffff7c30,
                           (char *)CONCAT17(in_stack_ffffffffffff7c2f,in_stack_ffffffffffff7c28)),
         !bVar1)) {
        if (local_20 != (char *)0x0) {
          usage((char **)0x10462a);
          return 1;
        }
        local_20 = local_30;
      }
      else {
        local_21 = 0;
      }
    }
    else {
      local_22 = 1;
    }
    local_28 = local_28 + 1;
  }
  usage((char **)0x104559);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  bool allowFlags = true;
  bool hex = false;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--hex")) {
      hex = true;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  {
    char buffer[32768];
    s.reserve(sizeof(buffer));

    while (ifs.good()) {
      ifs.read(&buffer[0], sizeof(buffer));
      s.append(buffer, checkOverflow(ifs.gcount()));
    }
  }
  ifs.close();

  if (hex) {
    s = convertFromHex(s);
  }

  Options options;
  options.checkAttributeUniqueness = true;
  options.validateUtf8Strings = true;

  try {
    Validator validator(&options);
    validator.validate(reinterpret_cast<uint8_t const*>(s.data()), s.size(),
                       false);
    std::cout << "The velocypack in infile '" << infile << "' is valid"
              << std::endl;
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while processing infile '" << infile
              << "': " << ex.what() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while processing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}